

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCone.c
# Opt level: O1

int Gia_ManConeMark_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vRoots,int nLimit)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  
  pGVar2 = p->pObjs;
  if ((pObj < pGVar2) || (pGVar2 + p->nObjs <= pObj)) {
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  iVar4 = (int)((long)pObj - (long)pGVar2 >> 2) * -0x55555555;
  if (p->nTravIdsAlloc <= iVar4) {
    __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x229,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
  }
  if (p->pTravIds[iVar4] == p->nTravIds) {
    return 0;
  }
  p->pTravIds[iVar4] = p->nTravIds;
  uVar3 = *(ulong *)pObj;
  uVar6 = (uint)uVar3;
  uVar5 = uVar3 & 0x1fffffff;
  if (uVar5 == 0x1fffffff || (int)uVar6 < 0) {
    if (-1 < (int)uVar6 || (int)uVar5 == 0x1fffffff) {
      if ((uVar6 & 0x9fffffff) != 0x9fffffff) {
LAB_0066135f:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCone.c"
                      ,0xf3,"int Gia_ManConeMark_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, int)");
      }
      uVar6 = (uint)(uVar3 >> 0x20);
      if ((int)(uVar6 & 0x1fffffff) < p->vCis->nSize - p->nRegs) {
        if (p->vCis->nSize - p->nRegs <= (int)(uVar6 & 0x1fffffff)) goto LAB_0066135f;
      }
      else {
        iVar4 = p->vCis->nSize;
        if ((int)(uVar6 & 0x1fffffff) < iVar4 - p->nRegs) {
          __assert_fail("Gia_ObjIsRo(p, pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1cf,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
        }
        iVar1 = p->vCos->nSize;
        uVar6 = (iVar1 - iVar4) + (uVar6 & 0x1fffffff);
        if (((int)uVar6 < 0) || (iVar1 <= (int)uVar6)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar4 = p->vCos->pArray[uVar6];
        if ((iVar4 < 0) || (p->nObjs <= iVar4)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        Vec_IntPush(vRoots,iVar4);
      }
      goto LAB_006613de;
    }
    iVar4 = Gia_ManConeMark_rec(p,pObj + -uVar5,vRoots,nLimit);
  }
  else {
    iVar4 = Gia_ManConeMark_rec(p,pObj + -uVar5,vRoots,nLimit);
    if (iVar4 != 0) {
      return 1;
    }
    iVar4 = Gia_ManConeMark_rec(p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff),vRoots,
                                nLimit);
  }
  if (iVar4 != 0) {
    return 1;
  }
LAB_006613de:
  return (uint)(nLimit < vRoots->nSize);
}

Assistant:

int Gia_ManConeMark_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vRoots, int nLimit )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return 0;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( Gia_ObjIsAnd(pObj) )
    {
        if ( Gia_ManConeMark_rec( p, Gia_ObjFanin0(pObj), vRoots, nLimit ) )
            return 1;
        if ( Gia_ManConeMark_rec( p, Gia_ObjFanin1(pObj), vRoots, nLimit ) )
            return 1;
    }
    else if ( Gia_ObjIsCo(pObj) )
    {
        if ( Gia_ManConeMark_rec( p, Gia_ObjFanin0(pObj), vRoots, nLimit ) )
            return 1;
    }
    else if ( Gia_ObjIsRo(p, pObj) )
        Vec_IntPush( vRoots, Gia_ObjId(p, Gia_ObjRoToRi(p, pObj)) );
    else if ( Gia_ObjIsPi(p, pObj) )
    {}
    else assert( 0 );
    return (int)(Vec_IntSize(vRoots) > nLimit);
}